

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O2

void __thiscall MyCompiler::Condition::Condition(Condition *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Condition",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->pExpression2).super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->pExpression2).super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pRelOp).super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pRelOp).super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pExpression1).super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->pExpression1).super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

MyCompiler::Condition::Condition()
        : AbstractAstNode("Condition")
{}